

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer psVar1;
  ostream *poVar2;
  long lVar3;
  undefined1 auVar4 [8];
  double __val;
  double __val_00;
  double dVar5;
  undefined1 auStack_b8 [8];
  vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> cars;
  undefined1 local_98 [8];
  shared_ptr<SedanCar> myAuto;
  undefined1 local_80 [8];
  shared_ptr<Truck> myTruck;
  undefined1 local_50 [8];
  AutoPtr c;
  
  std::make_shared<SedanCar>();
  Auto::setNoOfPassengers((Auto *)local_98,4);
  Auto::setTailLoad((Auto *)local_98,101.5);
  (*(*(_func_int ***)local_98)[2])();
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             __val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "Total weight of my Sedan Car is: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
  {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)((myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Auto).noOfPassengers;
  }
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             lVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "No of References : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::make_shared<Truck>();
  Auto::setNoOfPassengers((Auto *)local_80,2);
  Auto::setTailLoad((Auto *)local_80,500.5);
  (*(*(_func_int ***)local_80)[2])();
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             __val_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "Total weight of my Truck Car is: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)((myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Auto).noOfPassengers;
  }
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             lVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "No of References : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::endl<char,std::char_traits<char>>(poVar2);
  auStack_b8 = (undefined1  [8])0x0;
  cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__shared_ptr<Auto,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SedanCar,void>
            ((__shared_ptr<Auto,(__gnu_cxx::_Lock_policy)2> *)local_50,
             (__shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2> *)local_98);
  std::vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>>::
  emplace_back<std::shared_ptr<Auto>>
            ((vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>> *)auStack_b8,
             (shared_ptr<Auto> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
  std::__shared_ptr<Auto,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Truck,void>
            ((__shared_ptr<Auto,(__gnu_cxx::_Lock_policy)2> *)local_50,
             (__shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2> *)local_80);
  std::vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>>::
  emplace_back<std::shared_ptr<Auto>>
            ((vector<std::shared_ptr<Auto>,std::allocator<std::shared_ptr<Auto>>> *)auStack_b8,
             (shared_ptr<Auto> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
  psVar1 = cars.super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (auVar4 = auStack_b8; auVar4 != (undefined1  [8])psVar1;
      auVar4 = (undefined1  [8])((long)auVar4 + 0x10)) {
    std::__shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2> *)auVar4);
    dVar5 = (double)(**(code **)(*(long *)local_50 + 0x10))();
    myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + dVar5)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
  }
  std::operator<<((ostream *)&std::cout,"Total weight of my cars are: ");
  poVar2 = std::ostream::_M_insert<double>
                     ((double)myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Now Objects have no references and are removed from memory automatically."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
  {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)((myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Auto).noOfPassengers;
  }
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             lVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "No of References : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)((myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Auto).noOfPassengers;
  }
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             lVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "No of References : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::~vector
            ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)auStack_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&myTruck);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&myAuto);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

	// Create 3 Objects
	// No deletes and no new operators are used.

	// This is my Auto.
	auto myAuto = std::make_shared<SedanCar>();
	myAuto->setNoOfPassengers(4);
	myAuto->setTailLoad(double(101.5));

	std::cout
			<< "Total weight of my Sedan Car is: "
					+ std::to_string(myAuto->getTotalWeight()) << std::endl;
	std::cout << "No of References : " + std::to_string(myAuto.use_count())
			<< std::endl;
	std::cout << "=======   Separator  ======== " << std::endl;

	// And this is my truck.
	auto myTruck = std::make_shared<Truck>();
	myTruck->setNoOfPassengers(2);
	myTruck->setTailLoad(double(500.50));

	std::cout
			<< "Total weight of my Truck Car is: "
					+ std::to_string(myTruck->getTotalWeight()) << std::endl;

	std::cout << "No of References : " + std::to_string(myTruck.use_count())
			<< std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	// Now let us make a vector of my cars.
	std::vector<AutoPtr> cars;
	cars.push_back(myAuto);
	cars.push_back(myTruck);

	double totalWeight = 0;

	for (AutoPtr c : cars) {
		totalWeight += c->getTotalWeight();
	}

	std::cout << "Total weight of my cars are: ";
	std::cout << +totalWeight << std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	std::cout
			<< "Now Objects have no references and are removed from memory automatically."
			<< std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	std::cout << "No of References : " + std::to_string(myAuto.use_count())
			<< std::endl;
	std::cout << "No of References : " + std::to_string(myTruck.use_count())
			<< std::endl;


	// No need to do the delete operations
	// Objects will be reference counted.

// Running Valgrind as test

// $ valgrind -v ./Example-1
//     ==4516==
//     ==4516== HEAP SUMMARY:
//     ==4516==     in use at exit: 0 bytes in 0 blocks
//     ==4516==   total heap usage: 6 allocs, 6 frees, 73,888 bytes allocated
//     ==4516==
//     ==4516== All heap blocks were freed -- no leaks are possible
//     ==4516==
//     ==4516== ERROR SUMMARY: 0 errors from 0 contexts (suppressed: 0 from 0)
//     ==4516== ERROR SUMMARY: 0 errors from 0 contexts (suppressed: 0 from 0)


	std::cout << "=======   Separator  ======== " << std::endl;

	return 0;
}